

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typename.h
# Opt level: O0

string * type_name<ArgPack<C,int,int>&>(void)

{
  bool bVar1;
  char *pcVar2;
  unique_ptr<char,_void_(*)(void_*)> *puVar3;
  string *in_RDI;
  unique_ptr<char,_void_(*)(void_*)> own;
  string *r;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffffa0;
  unique_ptr<char,_void_(*)(void_*)> *this;
  allocator local_22;
  undefined1 local_21;
  code *local_20;
  
  pcVar2 = std::type_info::name((type_info *)&ArgPack<C,int,int>::typeinfo);
  __cxa_demangle(pcVar2,0,0);
  local_20 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x107312);
  local_21 = 0;
  bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    puVar3 = (unique_ptr<char,_void_(*)(void_*)> *)
             std::unique_ptr<char,_void_(*)(void_*)>::get(in_stack_ffffffffffffffa0);
  }
  else {
    puVar3 = (unique_ptr<char,_void_(*)(void_*)> *)
             std::type_info::name((type_info *)&ArgPack<C,int,int>::typeinfo);
  }
  this = puVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,(char *)puVar3,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::__cxx11::string::operator+=(in_RDI,"&");
  local_21 = 1;
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(this);
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    typedef typename std::remove_reference<T>::type TR;
    std::unique_ptr<char, void(*)(void*)> own(
#ifndef _MSC_VER
        abi::__cxa_demangle(typeid(TR).name(), nullptr,
                            nullptr, nullptr),
#else
        nullptr,
#endif
        std::free);
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}